

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacWriteVer.c
# Opt level: O3

void Bac_ManWriteRange(Bac_Ntk_t *p,int Beg,int End)

{
  uint uVar1;
  int iVar2;
  size_t sVar3;
  void *pvVar4;
  
  uVar1 = *(uint *)((long)&p->pDesign + 4);
  if (uVar1 == *(uint *)&p->pDesign) {
    if ((int)uVar1 < 0x10) {
      if (*(void **)&p->NameId == (void *)0x0) {
        pvVar4 = malloc(0x10);
      }
      else {
        pvVar4 = realloc(*(void **)&p->NameId,0x10);
      }
      *(void **)&p->NameId = pvVar4;
      *(undefined4 *)&p->pDesign = 0x10;
    }
    else {
      sVar3 = (ulong)uVar1 * 2;
      if (*(void **)&p->NameId == (void *)0x0) {
        pvVar4 = malloc(sVar3);
      }
      else {
        pvVar4 = realloc(*(void **)&p->NameId,sVar3);
      }
      *(void **)&p->NameId = pvVar4;
      *(int *)&p->pDesign = (int)sVar3;
    }
  }
  else {
    pvVar4 = *(void **)&p->NameId;
  }
  iVar2 = *(int *)((long)&p->pDesign + 4);
  *(int *)((long)&p->pDesign + 4) = iVar2 + 1;
  *(undefined1 *)((long)pvVar4 + (long)iVar2) = 0x5b;
  if (-1 < End) {
    Vec_StrPrintNum((Vec_Str_t *)p,End);
    uVar1 = *(uint *)((long)&p->pDesign + 4);
    if (uVar1 == *(uint *)&p->pDesign) {
      if ((int)uVar1 < 0x10) {
        if (*(void **)&p->NameId == (void *)0x0) {
          pvVar4 = malloc(0x10);
        }
        else {
          pvVar4 = realloc(*(void **)&p->NameId,0x10);
        }
        *(void **)&p->NameId = pvVar4;
        *(undefined4 *)&p->pDesign = 0x10;
      }
      else {
        sVar3 = (ulong)uVar1 * 2;
        if (*(void **)&p->NameId == (void *)0x0) {
          pvVar4 = malloc(sVar3);
        }
        else {
          pvVar4 = realloc(*(void **)&p->NameId,sVar3);
        }
        *(void **)&p->NameId = pvVar4;
        *(int *)&p->pDesign = (int)sVar3;
      }
    }
    else {
      pvVar4 = *(void **)&p->NameId;
    }
    iVar2 = *(int *)((long)&p->pDesign + 4);
    *(int *)((long)&p->pDesign + 4) = iVar2 + 1;
    *(undefined1 *)((long)pvVar4 + (long)iVar2) = 0x3a;
  }
  Vec_StrPrintNum((Vec_Str_t *)p,Beg);
  uVar1 = *(uint *)((long)&p->pDesign + 4);
  if (uVar1 == *(uint *)&p->pDesign) {
    if ((int)uVar1 < 0x10) {
      if (*(void **)&p->NameId == (void *)0x0) {
        pvVar4 = malloc(0x10);
      }
      else {
        pvVar4 = realloc(*(void **)&p->NameId,0x10);
      }
      *(void **)&p->NameId = pvVar4;
      *(undefined4 *)&p->pDesign = 0x10;
    }
    else {
      sVar3 = (ulong)uVar1 * 2;
      if (*(void **)&p->NameId == (void *)0x0) {
        pvVar4 = malloc(sVar3);
      }
      else {
        pvVar4 = realloc(*(void **)&p->NameId,sVar3);
      }
      *(void **)&p->NameId = pvVar4;
      *(int *)&p->pDesign = (int)sVar3;
    }
  }
  else {
    pvVar4 = *(void **)&p->NameId;
  }
  iVar2 = *(int *)((long)&p->pDesign + 4);
  *(int *)((long)&p->pDesign + 4) = iVar2 + 1;
  *(undefined1 *)((long)pvVar4 + (long)iVar2) = 0x5d;
  return;
}

Assistant:

static inline void Bac_ManWriteRange( Bac_Ntk_t * p, int Beg, int End )
{
    Vec_Str_t * vStr = p->pDesign->vOut;
    Vec_StrPrintStr( vStr, "[" );
    if ( End >= 0 )
    {
        Vec_StrPrintNum( vStr, End );
        Vec_StrPrintStr( vStr, ":" );
    }
    Vec_StrPrintNum( vStr, Beg );
    Vec_StrPrintStr( vStr, "]" );
}